

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_remove<EasyUseMap<HashObject<256,32>,int>>(int iters)

{
  mapped_type *pmVar1;
  int in_EDI;
  double ut;
  int i;
  Rusage t;
  EasyUseMap<HashObject<256,_32>,_int> set;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  HashObject<256,_32> *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  key_type *in_stack_fffffffffffffdc8;
  map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  *in_stack_fffffffffffffdd0;
  size_t in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  double in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  undefined4 local_50;
  
  EasyUseMap<HashObject<256,_32>,_int>::EasyUseMap((EasyUseMap<HashObject<256,_32>,_int> *)0x1e2eeb)
  ;
  Rusage::Rusage((Rusage *)in_stack_fffffffffffffd90);
  for (local_50 = 0; local_50 < in_EDI; local_50 = local_50 + 1) {
    in_stack_fffffffffffffda4 = local_50 + 1;
    HashObject<256,_32>::HashObject(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
    pmVar1 = std::
             map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
             ::operator[](in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    *pmVar1 = in_stack_fffffffffffffda4;
  }
  Rusage::Reset((Rusage *)in_stack_fffffffffffffd90);
  for (local_50 = 0; local_50 < in_EDI; local_50 = local_50 + 1) {
    HashObject<256,_32>::HashObject(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
    std::
    map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::erase((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
             *)in_stack_fffffffffffffd90,
            (key_type *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  }
  Rusage::UserTime((Rusage *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  report(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
         in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  EasyUseMap<HashObject<256,_32>,_int>::~EasyUseMap
            ((EasyUseMap<HashObject<256,_32>,_int> *)0x1e3047);
  return;
}

Assistant:

static void time_map_remove(int iters) {
  MapType set;
  Rusage t;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  t.Reset();
  for (i = 0; i < iters; i++) {
    set.erase(i);
  }
  double ut = t.UserTime();

  report("map_remove", ut, iters, 0, 0);
}